

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseException.h
# Opt level: O3

void __thiscall
AutoArgParse::ParseException::ParseException
          (ParseException *this,ParseFailureReason failureReason,string *errorMessage)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__ParseException_00111a10;
  this->failureReason = failureReason;
  (this->errorMessage)._M_dataplus._M_p = (pointer)&(this->errorMessage).field_2;
  pcVar1 = (errorMessage->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->errorMessage,pcVar1,pcVar1 + errorMessage->_M_string_length);
  return;
}

Assistant:

ParseException(ParseFailureReason failureReason, std::string errorMessage)
        : failureReason(failureReason), errorMessage(errorMessage) {}